

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::sortArc(MyArc *arcs,int noArcs)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  MyArc t;
  undefined1 local_d8 [168];
  
  if (1 < noArcs) {
    pdVar8 = &arcs[1].coverRatio;
    uVar7 = 1;
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      uVar4 = uVar5 & 0xffffffff;
      pdVar2 = pdVar8;
      uVar3 = uVar7;
      do {
        uVar1 = uVar3 & 0xffffffff;
        if (*pdVar2 < arcs[(int)uVar4].coverRatio || *pdVar2 == arcs[(int)uVar4].coverRatio) {
          uVar1 = uVar4;
        }
        uVar4 = uVar1;
        uVar3 = uVar3 + 1;
        pdVar2 = pdVar2 + 0x15;
      } while ((uint)noArcs != uVar3);
      if (uVar5 != uVar4) {
        memcpy(local_d8,arcs + uVar5,0xa8);
        memcpy(arcs + uVar5,arcs + (int)uVar4,0xa8);
        memcpy(arcs + (int)uVar4,local_d8,0xa8);
      }
      uVar7 = uVar7 + 1;
      pdVar8 = pdVar8 + 0x15;
      uVar5 = uVar6;
    } while (uVar6 != noArcs - 1);
  }
  return;
}

Assistant:

void EDCircles::sortArc(MyArc * arcs, int noArcs)
{
	for (int i = 0; i<noArcs - 1; i++) {
		int max = i;
		for (int j = i + 1; j<noArcs; j++) {
			if (arcs[j].coverRatio > arcs[max].coverRatio) max = j;
		} //end-for

		if (max != i) {
			MyArc t = arcs[i];
			arcs[i] = arcs[max];
			arcs[max] = t;
		} // end-if
	} //end-for
}